

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Phase_Coding_Sine_Lowpass_Results.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  time_t tVar1;
  ANN *this;
  ANN *pAVar2;
  SignalGenerator_param *this_00;
  void *pvVar3;
  TemporalPhaseEncodingSynapse_param *pTVar4;
  TemporalPhaseDecodingSynapse_param *this_01;
  TemporalPhaseDecodingSynapse *this_02;
  Population *n_from;
  Population *n_to;
  Network_param *this_03;
  ostream *poVar5;
  Network *this_04;
  long in_RSI;
  int in_EDI;
  Network n;
  Network_param *n_param;
  TemporalPhaseDecodingSynapse *s4;
  TemporalPhaseDecodingSynapse_param *params4;
  TemporalPhaseEncodingSynapse *s3;
  TemporalPhaseEncodingSynapse_param *params3;
  TemporalPhaseDecodingSynapse *s2;
  TemporalPhaseDecodingSynapse_param *params2;
  TemporalPhaseEncodingSynapse *s1;
  TemporalPhaseEncodingSynapse_param *params1;
  Population *p5;
  Population *p4;
  Population *p3;
  ArtificialPopulation *p2;
  Population *p1;
  SignalGenerator_param *paramp1;
  ANN *ann;
  string filterType;
  double dt;
  double som_frequency;
  double window_length;
  double sine7;
  double sine6;
  double sine5;
  double sine4;
  double sine3;
  double sine2;
  double sine1;
  Synapse *in_stack_fffffffffffffd08;
  Network *in_stack_fffffffffffffd10;
  TemporalPhaseDecodingSynapse_param *in_stack_fffffffffffffd28;
  Population *in_stack_fffffffffffffd30;
  Population *in_stack_fffffffffffffd38;
  TemporalPhaseDecodingSynapse *in_stack_fffffffffffffd40;
  char *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  ANN *in_stack_fffffffffffffd58;
  ArtificialPopulation *in_stack_fffffffffffffd60;
  int size;
  string *in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdfc;
  Population *in_stack_fffffffffffffe00;
  Parameters *in_stack_fffffffffffffe28;
  string *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  int amount;
  Population *in_stack_fffffffffffffe40;
  allocator<char> local_189;
  string local_188 [32];
  void *local_168;
  undefined1 local_15a;
  allocator<char> local_159;
  string local_158 [32];
  void *local_138;
  undefined1 local_12a;
  allocator<char> local_129;
  string local_128 [32];
  void *local_108;
  void *local_100;
  undefined1 local_f2;
  allocator<char> local_f1;
  string local_f0 [32];
  void *local_d0;
  SignalGenerator_param *local_c8;
  string local_c0 [32];
  ANN *local_a0;
  allocator<char> local_81;
  string local_80 [32];
  double local_60;
  double local_58;
  pointer local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  double local_20;
  double local_18;
  long local_10;
  int local_8;
  int local_4;
  
  amount = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  tVar1 = time((time_t *)0x0);
  srand((uint)tVar1);
  local_18 = 1.0;
  local_20 = 0.0;
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = (pointer)0x4034000000000000;
  local_58 = 800000.0;
  local_60 = 0.0001;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  std::allocator<char>::~allocator(&local_81);
  if (local_8 == 0xc) {
    local_18 = atof(*(char **)(local_10 + 8));
    local_20 = atof(*(char **)(local_10 + 0x10));
    local_28 = atof(*(char **)(local_10 + 0x18));
    local_30 = atof(*(char **)(local_10 + 0x20));
    local_38 = atof(*(char **)(local_10 + 0x28));
    local_40 = atof(*(char **)(local_10 + 0x30));
    local_48 = atof(*(char **)(local_10 + 0x38));
    local_50 = (pointer)atof(*(char **)(local_10 + 0x40));
    local_58 = atof(*(char **)(local_10 + 0x48));
    local_60 = atof(*(char **)(local_10 + 0x50));
    std::__cxx11::string::operator=(local_80,*(char **)(local_10 + 0x58));
  }
  this = (ANN *)Clock::getInstance();
  Clock::setDt((Clock *)this,local_60);
  pAVar2 = (ANN *)operator_new(0x40);
  ANN::ANN((ANN *)in_stack_fffffffffffffd10);
  local_a0 = pAVar2;
  ANN::setInputSize(pAVar2,1);
  size = (int)((ulong)pAVar2 >> 0x20);
  pAVar2 = local_a0;
  std::__cxx11::string::string(local_c0,local_80);
  ANN::addLayer(this,size,(string *)pAVar2);
  std::__cxx11::string::~string(local_c0);
  this_00 = (SignalGenerator_param *)operator_new(0x58);
  this_00->offset = 0.0;
  this_00->noiseMean = 0.0;
  this_00->f7 = 0.0;
  this_00->scale = 0.0;
  this_00->f5 = 0.0;
  this_00->f6 = 0.0;
  this_00->f3 = 0.0;
  this_00->f4 = 0.0;
  this_00->f1 = 0.0;
  this_00->f2 = 0.0;
  this_00->noiseStd = 0.0;
  SignalGenerator_param::SignalGenerator_param(this_00);
  this_00->f1 = local_18;
  this_00->f2 = local_20;
  this_00->f3 = local_28;
  this_00->f4 = local_30;
  this_00->f5 = local_38;
  this_00->f6 = local_40;
  this_00->f7 = local_48;
  this_00->scale = 0.0625;
  this_00->offset = 0.5;
  local_c8 = this_00;
  pvVar3 = operator_new(0x60);
  local_f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe40,amount,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_f2 = 0;
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  local_d0 = pvVar3;
  pvVar3 = operator_new(0x98);
  ArtificialPopulation::ArtificialPopulation(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_100 = pvVar3;
  pvVar3 = operator_new(0x60);
  local_12a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  local_12a = 0;
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator(&local_129);
  local_108 = pvVar3;
  pvVar3 = operator_new(0x60);
  local_15a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  local_15a = 0;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator(&local_159);
  local_138 = pvVar3;
  pvVar3 = operator_new(0x60);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (allocator<char> *)in_stack_fffffffffffffd40);
  Population::Population
            (in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf0);
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator(&local_189);
  local_168 = pvVar3;
  pTVar4 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
  *(undefined8 *)pTVar4 = 0;
  pTVar4->som_phase = 0.0;
  pTVar4->window_length_s = 0.0;
  TemporalPhaseEncodingSynapse_param::TemporalPhaseEncodingSynapse_param(pTVar4);
  pTVar4->window_length_s = (double)local_50;
  pTVar4->som_frequency = (int)local_58;
  pTVar4->som_phase = 0.0;
  operator_new(0x78);
  TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse
            ((TemporalPhaseEncodingSynapse *)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30,
             (TemporalPhaseEncodingSynapse_param *)in_stack_fffffffffffffd28);
  this_01 = (TemporalPhaseDecodingSynapse_param *)operator_new(0x20);
  this_01->window_length_s = 0.0;
  this_01->delay_s = 0.0;
  *(undefined8 *)this_01 = 0;
  this_01->som_phase = 0.0;
  TemporalPhaseDecodingSynapse_param::TemporalPhaseDecodingSynapse_param(this_01);
  this_01->window_length_s = (double)local_50;
  this_01->som_frequency = (int)local_58;
  this_01->som_phase = 0.0;
  pvVar3 = operator_new(0x78);
  TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd28);
  pTVar4 = (TemporalPhaseEncodingSynapse_param *)operator_new(0x18);
  *(undefined8 *)pTVar4 = 0;
  pTVar4->som_phase = 0.0;
  pTVar4->window_length_s = 0.0;
  TemporalPhaseEncodingSynapse_param::TemporalPhaseEncodingSynapse_param(pTVar4);
  pTVar4->window_length_s = (double)local_50;
  pTVar4->som_frequency = (int)local_58;
  pTVar4->som_phase = 0.0;
  this_02 = (TemporalPhaseDecodingSynapse *)operator_new(0x78);
  TemporalPhaseEncodingSynapse::TemporalPhaseEncodingSynapse
            ((TemporalPhaseEncodingSynapse *)this_02,in_stack_fffffffffffffd38,
             in_stack_fffffffffffffd30,
             (TemporalPhaseEncodingSynapse_param *)in_stack_fffffffffffffd28);
  n_from = (Population *)operator_new(0x20);
  (n_from->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (n_from->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  n_from->_vptr_Population = (_func_int **)0x0;
  (n_from->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  TemporalPhaseDecodingSynapse_param::TemporalPhaseDecodingSynapse_param
            ((TemporalPhaseDecodingSynapse_param *)n_from);
  (n_from->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_finish = local_50;
  *(int *)&n_from->_vptr_Population = (int)local_58;
  (n_from->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  n_to = (Population *)operator_new(0x78);
  TemporalPhaseDecodingSynapse::TemporalPhaseDecodingSynapse
            (this_02,n_from,n_to,in_stack_fffffffffffffd28);
  this_03 = (Network_param *)operator_new(8);
  this_03->dt = 0.0;
  Network_param::Network_param(this_03);
  this_03->dt = local_60;
  Network::Network((Network *)this_02,(Network_param *)n_from);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  Network::add(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)pvVar3);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(long)n_to);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  this_04 = (Network *)std::ostream::operator<<((ostream *)&std::cout,(long)local_108);
  std::ostream::operator<<((ostream *)this_04,std::endl<char,std::char_traits<char>>);
  Network::run((Network *)this_02,(double)n_from);
  local_4 = 0;
  Network::~Network(this_04);
  std::__cxx11::string::~string(local_80);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) 
{
    srand(time(NULL));

    // Command line arguments
    double sine1 = 1;
    double sine2 = 0;
    double sine3 = 0;
    double sine4 = 0;
    double sine5 = 0;
    double sine6 = 0;
    double sine7 = 0;
    double window_length = 20;
    double som_frequency = 800000;
    double dt = 0.0001;
    string filterType = "lowpass";
    if(argc == 12) {
        sine1 = atof(argv[1]);
        sine2 = atof(argv[2]);
        sine3 = atof(argv[3]);
        sine4 = atof(argv[4]);
        sine5 = atof(argv[5]);
        sine6 = atof(argv[6]);
        sine7 = atof(argv[7]);
        window_length = atof(argv[8]);
        som_frequency = atof(argv[9]);
        dt = atof(argv[10]);
        filterType = argv[11];
    }
    // ----------------------

    Clock::getInstance()->setDt(dt);

    ANN* ann = new ANN();
    ann->setInputSize(1);
    ann->addLayer(1, filterType);

    // Populations
    SignalGenerator_param* paramp1 = new SignalGenerator_param();
    paramp1->f1 = sine1;
    paramp1->f2 = sine2;
    paramp1->f3 = sine3;
    paramp1->f4 = sine4;
    paramp1->f5 = sine5;
    paramp1->f6 = sine6;
    paramp1->f7 = sine7;
    paramp1->scale = 1/16.0;
    paramp1->offset = 0.5;
    Population* p1 = new Population(1, "SignalGenerator", paramp1);

    ArtificialPopulation* p2 = new ArtificialPopulation(ann);

    Population* p3 = new Population(1, "PassThrough");
    Population* p4 = new Population(1, "PassThrough");
    Population* p5 = new Population(1, "PassThrough");

    // Synapses
    TemporalPhaseEncodingSynapse_param* params1 = new TemporalPhaseEncodingSynapse_param();
    params1->window_length_s = window_length;
    params1->som_frequency = som_frequency;
    params1->som_phase = 0;
    TemporalPhaseEncodingSynapse* s1 = new TemporalPhaseEncodingSynapse(p1, p3, params1);

    TemporalPhaseDecodingSynapse_param* params2 = new TemporalPhaseDecodingSynapse_param();
    params2->window_length_s = window_length;
    params2->som_frequency = som_frequency;
    params2->som_phase = 0;
    TemporalPhaseDecodingSynapse* s2 = new TemporalPhaseDecodingSynapse(p3, p2, params2);

    // Synapses
    TemporalPhaseEncodingSynapse_param* params3 = new TemporalPhaseEncodingSynapse_param();
    params3->window_length_s = window_length;
    params3->som_frequency = som_frequency;
    params3->som_phase = 0;
    TemporalPhaseEncodingSynapse* s3 = new TemporalPhaseEncodingSynapse(p2, p4, params3);

    TemporalPhaseDecodingSynapse_param* params4 = new TemporalPhaseDecodingSynapse_param();
    params4->window_length_s = window_length;
    params4->som_frequency = som_frequency;
    params4->som_phase = 0;
    TemporalPhaseDecodingSynapse* s4 = new TemporalPhaseDecodingSynapse(p4, p5, params4);

    // Create the network
    Network_param* n_param = new Network_param();
    n_param->dt = dt;
    Network n = Network(n_param);

    // Add the synapse to the network
    n.add(s1);
    n.add(s2);
    n.add(s3);
    n.add(s4);

    cout << (long)s2 << endl;
    cout << (long)s4 << endl;
    cout << (long)p3 << endl;

    // Run the network for 1 second
    n.run(1.0);
    
    return 0;
}